

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * __thiscall
lest::string_maker<std::basic_string_view<char,std::char_traits<char>>>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,
          string_maker<std::basic_string_view<char,std::char_traits<char>>> *this,
          basic_string_view<char,_std::char_traits<char>_> *value)

{
  basic_ostream<char,_std::char_traits<char>_> *__os;
  ostringstream local_190 [8];
  ostringstream os;
  basic_string_view<char,_std::char_traits<char>_> *value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  __os = (basic_ostream<char,_std::char_traits<char>_> *)
         std::ostream::operator<<(local_190,std::boolalpha);
  std::operator<<(__os,*(basic_string_view<char,_std::char_traits<char>_> *)this);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string( T const & value )
    {
        std::ostringstream os; os << std::boolalpha << value;
        return os.str();
    }